

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pem_all.cc
# Opt level: O0

EC_KEY * pkey_get_eckey(EVP_PKEY *key,EC_KEY **eckey)

{
  EC_KEY *dtmp;
  EC_KEY **eckey_local;
  EVP_PKEY *key_local;
  
  if (key == (EVP_PKEY *)0x0) {
    key_local = (EVP_PKEY *)0x0;
  }
  else {
    key_local = (EVP_PKEY *)EVP_PKEY_get1_EC_KEY((EVP_PKEY *)key);
    EVP_PKEY_free((EVP_PKEY *)key);
    if ((EC_KEY *)key_local == (EC_KEY *)0x0) {
      key_local = (EVP_PKEY *)0x0;
    }
    else if (eckey != (EC_KEY **)0x0) {
      EC_KEY_free((EC_KEY *)*eckey);
      *eckey = (EC_KEY *)key_local;
    }
  }
  return (EC_KEY *)key_local;
}

Assistant:

static EC_KEY *pkey_get_eckey(EVP_PKEY *key, EC_KEY **eckey) {
  EC_KEY *dtmp;
  if (!key) {
    return NULL;
  }
  dtmp = EVP_PKEY_get1_EC_KEY(key);
  EVP_PKEY_free(key);
  if (!dtmp) {
    return NULL;
  }
  if (eckey) {
    EC_KEY_free(*eckey);
    *eckey = dtmp;
  }
  return dtmp;
}